

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Field<char[6],_std::vector<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>_>,_char>
                            *o)

{
  ostream *poVar1;
  JSON<const_char_*,_char> local_38;
  char (*local_28) [6];
  char local_19;
  
  local_28 = o->object->k;
  local_38.context = &local_19;
  local_19 = '\0';
  local_38.object = (char **)&local_28;
  poVar1 = operator<<(os,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  print_container<std::vector<pstack::Dwarf::FileEntry,std::allocator<pstack::Dwarf::FileEntry>>,char_const&>
            (poVar1,o->object->v,o->context);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}